

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_range.cpp
# Opt level: O1

ExprPtr __thiscall
mathiu::impl::functionRangeImpl(impl *this,ExprPtr *function,ExprPtr *symbol,ExprPtr *domain)

{
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> _Var1;
  impl *this_00;
  impl *this_01;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  variant_alternative_t<1UL,_variant<monostate,_const_pair<pair<shared_ptr<const_Expr>,_bool>,_pair<shared_ptr<const_Expr>,_bool>_>_*,_const_SetOp_*,_const_Union_*,_bool>_>
  *value;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> _Var6;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> *value_00;
  variant_alternative_t<3UL,_variant<monostate,_const_pair<pair<shared_ptr<const_Expr>,_bool>,_pair<shared_ptr<const_Expr>,_bool>_>_*,_const_SetOp_*,_const_Union_*,_bool>_>
  *value_01;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>_&>
  pIVar7;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Union,_mathiu::impl::Union_*,_const_mathiu::impl::Union_*>_&>
  pUVar8;
  _Base_ptr p_Var9;
  logic_error *this_02;
  ExprPtr *ex;
  ExprPtr *ex_00;
  ExprPtr *ex_01;
  ExprPtr *ex_02;
  ExprPtr *ex_03;
  ExprPtr *ex_04;
  ExprPtr *ex_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  IdProcess idProcess;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> *this_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> _Var10;
  _Rb_tree_header *p_Var11;
  ExprPtr EVar12;
  ContextT context;
  Id<mathiu::impl::Union> iUnion;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> local_4b8;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> _Stack_4b0;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> *local_4a8;
  impl *local_4a0;
  IdProcess local_494;
  impl *local_490;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> local_488;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> _Stack_480;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_478;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  _Stack_470;
  undefined8 uStack_430;
  anon_class_1_0_00000001 *local_428;
  InternalPatternT<bool> IStack_420;
  undefined7 uStack_41f;
  anon_class_1_0_00000001 *local_418;
  InternalPatternT<bool> IStack_410;
  undefined7 uStack_40f;
  impl *local_400;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> local_3f8;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> _Stack_3f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3e8;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  local_3e0;
  anon_class_1_0_00000001 *local_398;
  InternalPatternT<bool> IStack_390;
  undefined7 uStack_38f;
  undefined1 local_380 [8];
  undefined1 auStack_378 [24];
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  _Stack_360;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_318;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_308;
  Id<mathiu::impl::Union> *local_2f8;
  impl *local_2f0;
  impl *local_2e8;
  string local_2e0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  local_2c0;
  anon_class_1_0_00000001 *local_278;
  InternalPatternT<bool> IStack_270;
  undefined7 uStack_26f;
  anon_class_1_0_00000001 *local_268;
  InternalPatternT<bool> IStack_260;
  undefined7 uStack_25f;
  string local_258;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  local_238;
  anon_class_1_0_00000001 *local_1f0;
  InternalPatternT<bool> IStack_1e8;
  undefined7 uStack_1e7;
  anon_class_1_0_00000001 *local_1e0;
  InternalPatternT<bool> IStack_1d8;
  undefined7 uStack_1d7;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_1b8;
  impl *local_1a8;
  ExprPtr *local_1a0;
  ExprPtr *local_198;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> local_190;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_188;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  local_180;
  anon_class_1_0_00000001 *local_138;
  InternalPatternT<bool> IStack_130;
  undefined7 uStack_12f;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  local_128;
  undefined1 local_e0 [64];
  __index_type local_a0;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  _Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> local_88 [9];
  anon_class_1_0_00000001 *local_40;
  InternalPatternT<bool> IStack_38;
  undefined7 uStack_37;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"functionRangeImpl: ",0x13);
  local_4a0 = (impl *)function;
  toString_abi_cxx11_((string *)local_380,(impl *)function,ex);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_380,auStack_378._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",\t",2);
  toString_abi_cxx11_(&local_2e0,(impl *)symbol,ex_00);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",\t",2);
  toString_abi_cxx11_(&local_258,(impl *)domain,ex_01);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if (local_380 != (undefined1  [8])(auStack_378 + 8)) {
    operator_delete((void *)local_380,auStack_378._8_8_ + 1);
  }
  local_380 = (undefined1  [8])((ulong)local_380 & 0xffffffff00000000);
  auStack_378._0_8_ = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
  auStack_378._8_8_ = 0;
  auStack_378._16_8_ = 0;
  _Stack_360._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>_*>)0x0;
  _Stack_360._8_8_ = 0;
  _Stack_360._16_8_ = 0;
  _Stack_360._24_8_ = 0;
  local_e0._0_4_ = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_mathiu::impl::Union,_mathiu::impl::Union_*,_const_mathiu::impl::Union_*>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_mathiu::impl::Union,_mathiu::impl::Union_*,_const_mathiu::impl::Union_*>
                     *)(local_e0 + 8),
                    (_Move_ctor_base<false,_std::monostate,_mathiu::impl::Union,_mathiu::impl::Union_*,_const_mathiu::impl::Union_*>
                     *)auStack_378);
  local_a0 = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Union,_mathiu::impl::Union_*,_const_mathiu::impl::Union_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Union,_mathiu::impl::Union_*,_const_mathiu::impl::Union_*>
                       *)auStack_378);
  _Var1 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)
          (domain->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1a8 = local_4a0;
  local_1d0 = &matchit::impl::
               asPointer<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>>
  ;
  local_1c8 = &matchit::impl::deref;
  local_1b8.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_1b8.mPattern = true;
  local_490 = (impl *)symbol;
  local_400 = (impl *)domain;
  local_1a0 = symbol;
  local_198 = domain;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&local_128,(Id<mathiu::impl::Union> *)local_e0);
  matchit::impl::as<mathiu::impl::Union>::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<mathiu::impl::Union>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Union>_>_>_>
              *)&local_98._M_first,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Union>,
             (Id<mathiu::impl::Union> *)&local_128);
  local_190 = local_98;
  p_Stack_188 = p_Stack_90;
  local_4a8 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> *)this;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&local_180,(Id<mathiu::impl::Union> *)&local_88[0]._M_first)
  ;
  local_138 = local_40;
  IStack_130 = IStack_38;
  uStack_12f = uStack_37;
  local_3f8 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)
              &matchit::impl::deref;
  _Stack_3f0 = local_190;
  p_Stack_3e8 = p_Stack_188;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&local_3e0._M_first,(Id<mathiu::impl::Union> *)&local_180);
  local_398 = local_138;
  IStack_390 = IStack_130;
  uStack_38f = uStack_12f;
  local_488 = local_3f8;
  _Stack_480 = _Stack_3f0;
  p_Stack_478 = p_Stack_3e8;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&_Stack_470._M_first,
             (Id<mathiu::impl::Union> *)&local_3e0._M_first);
  local_428 = local_398;
  IStack_420 = IStack_390;
  uStack_41f = uStack_38f;
  local_418 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  IStack_410 = true;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)&local_3e0._M_first);
  local_258._M_dataplus._M_p = "";
  local_258._M_string_length = (size_type)local_488;
  local_258.field_2._M_allocated_capacity = (size_type)_Stack_480;
  local_258.field_2._8_8_ = p_Stack_478;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&local_238,(Id<mathiu::impl::Union> *)&_Stack_470._M_first);
  local_1f0 = local_428;
  IStack_1e8 = IStack_420;
  uStack_1e7 = uStack_41f;
  uStack_1d7 = uStack_40f;
  IStack_1d8 = IStack_410;
  local_1e0 = local_418;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)&_Stack_470._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage(&local_180);
  local_2e0._M_dataplus._M_p = local_258._M_dataplus._M_p;
  local_2e0._M_string_length = local_258._M_string_length;
  local_2e0.field_2._M_allocated_capacity = local_258.field_2._M_allocated_capacity;
  local_2e0.field_2._8_8_ = local_258.field_2._8_8_;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&local_2c0,(Id<mathiu::impl::Union> *)&local_238);
  this_03 = local_4a8;
  local_278 = local_1f0;
  IStack_270 = IStack_1e8;
  uStack_26f = uStack_1e7;
  local_268 = local_1e0;
  IStack_260 = IStack_1d8;
  uStack_25f = uStack_1d7;
  local_380 = (undefined1  [8])local_2e0._M_dataplus._M_p;
  auStack_378._0_8_ = local_2e0._M_string_length;
  auStack_378._8_8_ = local_2e0.field_2._M_allocated_capacity;
  auStack_378._16_8_ = local_2e0.field_2._8_8_;
  matchit::impl::Id<mathiu::impl::Union>::Id
            ((Id<mathiu::impl::Union> *)&_Stack_360._M_first,(Id<mathiu::impl::Union> *)&local_2c0);
  local_318.mUnary = local_278;
  local_318.mPattern = IStack_270;
  local_318._9_7_ = uStack_26f;
  local_308.mUnary = local_268;
  local_308.mPattern = IStack_260;
  local_308._9_7_ = uStack_25f;
  local_2f0 = local_4a0;
  local_2e8 = local_490;
  _Stack_470._56_8_ = 0;
  uStack_430 = 0;
  _Stack_470._40_8_ = 0;
  _Stack_470._48_8_ = 0;
  _Stack_470._24_8_ = 0;
  _Stack_470._32_8_ = 0;
  _Stack_470._8_8_ = 0;
  _Stack_470._16_8_ = 0;
  p_Stack_478 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_470._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>_*>)0x0;
  local_488 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
  _Stack_480 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
  lVar5 = 8;
  do {
    *(undefined1 *)((long)&local_488 + lVar5) = 0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x68);
  local_428 = (anon_class_1_0_00000001 *)0x0;
  local_3f8 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
  if (*(__index_type *)((long)_Var1 + 0x38) == '\x12') {
    local_3f8 = _Var1;
  }
  local_2f8 = (Id<mathiu::impl::Union> *)local_e0;
  std::
  variant<std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
  ::operator=((variant<std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
               *)&local_488._M_first,
              (pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>
               **)&local_3f8);
  lVar5 = (long)local_428 * 2;
  local_428 = (anon_class_1_0_00000001 *)((long)local_428 + 1);
  value = std::
          get<1ul,std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
                    ((variant<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
                      *)&(&local_488)[lVar5]._M_first);
  bVar3 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*&,matchit::impl::Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>>
                    (value,&local_1b8,2,
                     (Context<const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool>
                      *)&local_488._M_first);
  if (bVar3) {
    functionRangeImplIntervalDomain
              ((Interval *)&local_3f8._M_first,(ExprPtr *)local_1a8,local_1a0,local_198);
    _Var6 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)operator_new(0x50);
    uVar2 = local_3e0._8_8_;
    _Var1 = _Stack_3f0;
    *(undefined8 *)((long)_Var6 + 8) = 0x100000001;
    *(undefined ***)_Var6 = &PTR___Sp_counted_ptr_inplace_00253718;
    _Var10 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)
             ((long)_Var6 + 0x10);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var6 + 0x10))->_vptr__Sp_counted_base =
         (_func_int **)local_3f8;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var6 + 0x10))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var6 + 0x10))->_M_weak_count = 0;
    _Stack_3f0 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
    *(_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var6 + 0x10))->_M_use_count = _Var1;
    local_3f8 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
    *(undefined1 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var6 + 0x20))->_vptr__Sp_counted_base
         = p_Stack_3e8._0_1_;
    *(_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>_*> *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var6 + 0x20))->_M_use_count =
         local_3e0._M_rest;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var6 + 0x30))->_vptr__Sp_counted_base =
         (_func_int **)0x0;
    local_3e0._8_8_ = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var6 + 0x30))->_vptr__Sp_counted_base =
         (_func_int **)uVar2;
    local_3e0._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>_*>)0x0;
    *(uchar *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var6 + 0x30))->_M_use_count
         = local_3e0._M_first._M_storage._M_storage[0x10];
    *(undefined1 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var6 + 0x40))->_M_use_count = 0x12;
  }
  else {
    _Var6 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
    _Var10 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
    _Stack_470._56_8_ = 0;
    uStack_430 = 0;
    _Stack_470._40_8_ = 0;
    _Stack_470._48_8_ = 0;
    _Stack_470._24_8_ = 0;
    _Stack_470._32_8_ = 0;
    _Stack_470._8_8_ = 0;
    _Stack_470._16_8_ = 0;
    p_Stack_478 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_470._M_rest = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Union>_*>)0x0;
    local_488 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
    _Stack_480 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
    lVar5 = 8;
    do {
      *(undefined1 *)((long)&local_488 + lVar5) = 0;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x68);
    local_428 = (anon_class_1_0_00000001 *)0x0;
    local_3f8 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
    if (*(__index_type *)((long)_Var1 + 0x38) == '\x16') {
      local_3f8 = _Var1;
    }
    std::
    variant<std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
    ::operator=((variant<std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
                 *)&local_488._M_first,(SetOp **)&local_3f8);
    lVar5 = (long)local_428 * 2;
    local_428 = (anon_class_1_0_00000001 *)((long)local_428 + 1);
    value_00 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*> *)
               std::
               get<2ul,std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
                         ((variant<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
                           *)&(&local_488)[lVar5]._M_first);
    bVar3 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<mathiu::impl::SetOp_const*&,matchit::impl::Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>>
                      ((SetOp **)value_00,&local_308,2,
                       (Context<const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool>
                        *)&local_488._M_first);
    if (bVar3) {
      local_3f8 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
      if (*(__index_type *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)*value_00 + 0x30))->
            _vptr__Sp_counted_base == '\0') {
        local_3f8 = *value_00;
      }
      std::
      variant<std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
      ::operator=((variant<std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
                   *)&(&local_488)[(long)local_428 * 2]._M_first,(Union **)&local_3f8);
      lVar5 = (long)local_428 * 2;
      local_428 = (anon_class_1_0_00000001 *)((long)local_428 + 1);
      value_01 = std::
                 get<3ul,std::monostate,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,mathiu::impl::SetOp_const*,mathiu::impl::Union_const*,bool>
                           ((variant<std::monostate,_const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_const_mathiu::impl::SetOp_*,_const_mathiu::impl::Union_*,_bool>
                             *)&(&local_488)[lVar5]._M_first);
      bVar3 = matchit::impl::
              PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
              ::
              matchPatternImpl<mathiu::impl::Union_const*&,matchit::impl::Context<std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>const*,bool,mathiu::impl::SetOp_const*,bool,mathiu::impl::Union_const*,bool>>
                        (value_01,&local_318,5,
                         (Context<const_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*,_bool,_const_mathiu::impl::SetOp_*,_bool,_const_mathiu::impl::Union_*,_bool>
                          *)&local_488._M_first);
      if (bVar3) {
        bVar3 = matchit::impl::Id<mathiu::impl::Union>::matchValue<mathiu::impl::Union_const&>
                          ((Id<mathiu::impl::Union> *)&_Stack_360._M_first,*value_01);
        idProcess = (IdProcess)bVar3;
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                  ((Id<mathiu::impl::Union> *)&_Stack_360._M_first,6,idProcess);
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                  ((Id<mathiu::impl::Union> *)&_Stack_360._M_first,5,(uint)bVar3);
      }
      else {
        idProcess = kCANCEL;
      }
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                ((Id<mathiu::impl::Union> *)&_Stack_360._M_first,4,idProcess);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                ((Id<mathiu::impl::Union> *)&_Stack_360._M_first,3,idProcess);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
                ((Id<mathiu::impl::Union> *)&_Stack_360._M_first,2,idProcess);
    }
    else {
      idProcess = kCANCEL;
    }
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
              ((Id<mathiu::impl::Union> *)&_Stack_360._M_first,1,idProcess);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Union>_>::processIdImpl
              ((Id<mathiu::impl::Union> *)&_Stack_360._M_first,0,idProcess);
    if (idProcess != kCANCEL) {
      local_4b8 = false_;
      _Stack_4b0 = DAT_0025d688;
      if (DAT_0025d688 != (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0)
      {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)DAT_0025d688 + 8) = *(_Atomic_word *)((long)DAT_0025d688 + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)DAT_0025d688 + 8) = *(_Atomic_word *)((long)DAT_0025d688 + 8) + 1;
        }
      }
      local_494 = idProcess;
      pIVar7 = std::
               visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Union>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Union>&)_1_,matchit::impl::Id<mathiu::impl::Union>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Union>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Union>,matchit::impl::IdBlock<mathiu::impl::Union>*>&>
                         ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                           *)&local_3f8._M_first,&local_2f8->mBlock);
      pUVar8 = std::
               visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Union>::get()const::_lambda(mathiu::impl::Union_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Union>::get()const::_lambda(mathiu::impl::Union_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Union>::get()const::_lambda(mathiu::impl::Union*)_1_,matchit::impl::IdBlock<mathiu::impl::Union>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Union,mathiu::impl::Union*,mathiu::impl::Union_const*>const&>
                         ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                           *)&local_3f8._M_first,
                          &(pIVar7->super_IdBlockBase<mathiu::impl::Union>).mVariant);
      p_Var9 = (pUVar8->super_ExprPtrSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var11 = &(pUVar8->super_ExprPtrSet)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var9 != p_Var11) {
        do {
          functionRangeImpl((impl *)&local_190._M_first,(ExprPtr *)local_2f0,(ExprPtr *)local_2e8,
                            (ExprPtr *)(p_Var9 + 1));
          union_((impl *)&local_3f8._M_first,(ExprPtr *)&local_4b8._M_first,
                 (ExprPtr *)&local_190._M_first);
          _Var10 = _Stack_3f0;
          local_4b8 = local_3f8;
          _Var1 = _Stack_4b0;
          local_3f8 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
          _Stack_3f0 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
          _Stack_4b0 = _Var10;
          if (_Var1 != (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1);
          }
          if (_Stack_3f0 != (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0
             ) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_3f0);
          }
          if (p_Stack_188 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_188);
          }
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var11);
      }
      _Var6 = _Stack_4b0;
      _Var10 = local_4b8;
      _Stack_4b0 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
      local_4b8 = (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)0x0;
      this_03 = local_4a8;
      idProcess = local_494;
    }
    if (idProcess == kCANCEL) {
      this_02 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_02,"Mismatch in functionRangeImpl!");
      __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  *this_03 = _Var10;
  this_03[1] = _Var6;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)&_Stack_360._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage(&local_2c0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage(&local_238);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)&local_88[0]._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage(&local_128);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"functionRangeImpl: ",0x13);
  toString_abi_cxx11_((string *)local_380,local_4a0,ex_02);
  this_01 = local_400;
  this_00 = local_490;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_380,auStack_378._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",\t",2);
  toString_abi_cxx11_(&local_2e0,this_00,ex_03);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",\t",2);
  toString_abi_cxx11_(&local_258,this_01,ex_04);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,",\tresult: ",10);
  toString_abi_cxx11_((string *)&local_488._M_first,(impl *)&this_03->_M_first,ex_05);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_488,(long)_Stack_480);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_488 != (_Variadic_union<mathiu::impl::Union_*,_const_mathiu::impl::Union_*>)&p_Stack_478
     ) {
    operator_delete((void *)local_488,(long)p_Stack_478 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,(ulong)(local_258.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,(ulong)(local_2e0.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_380 != (undefined1  [8])(auStack_378 + 8)) {
    operator_delete((void *)local_380,(ulong)(auStack_378._8_8_ + 1));
  }
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Union>,_matchit::impl::IdBlock<mathiu::impl::Union>_*>
                       *)local_e0);
  EVar12.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  EVar12.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_03;
  return (ExprPtr)EVar12.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr functionRangeImpl(ExprPtr const &function, ExprPtr const &symbol, ExprPtr const &domain)
    {
#if DEBUG
        std::cout << "functionRangeImpl: " << toString(function) << ",\t" << toString(symbol) << ",\t" << toString(domain) << std::endl;
#endif // DEBUG

        Id<Union> iUnion;
        auto result = match(*domain)(
            pattern | as<Interval>(_) = [&]
            { return makeSharedExprPtr(functionRangeImplIntervalDomain(function, symbol, domain)); },
            pattern | as<SetOp>(as<Union>(iUnion)) = [&]
            {
                ExprPtr result = false_;
                for (auto &&e : *iUnion)
                {
                    result = union_(result, functionRangeImpl(function, symbol, e));
                }
                return result;
            },
            pattern | _ = [&]
            {
                throw std::logic_error{"Mismatch in functionRangeImpl!"};
                return false_;
            });
#if DEBUG
        std::cout << "functionRangeImpl: " << toString(function) << ",\t" << toString(symbol) << ",\t" << toString(domain) << ",\tresult: " << toString(result) << std::endl;
#endif // DEBUG

        return result;
    }